

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

Layer * ncnn::create_layer(char *type)

{
  int iVar1;
  Layer *pLVar2;
  int i;
  ulong uVar3;
  undefined **ppuVar4;
  
  ppuVar4 = &PTR_AbsVal_layer_creator_0013c358;
  uVar3 = 0;
  while (iVar1 = strcmp(type,ppuVar4[-1]), iVar1 != 0) {
    uVar3 = uVar3 + 1;
    ppuVar4 = ppuVar4 + 2;
    if (uVar3 == 0x37) {
      return (Layer *)0x0;
    }
  }
  if (0x36 < uVar3) {
    return (Layer *)0x0;
  }
  if ((0xe400000002U >> (uVar3 & 0x3f) & 1) != 0) {
    return (Layer *)0x0;
  }
  pLVar2 = (Layer *)(*(code *)*ppuVar4)();
  return pLVar2;
}

Assistant:

Layer* create_layer(const char* type)
{
    int index = layer_to_index(type);
    if (index == -1)
        return 0;

    return create_layer(index);
}